

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec16.c
# Opt level: O2

uint If_CluSemiCanonicize(word *pTruth,int nVars,int *pCanonPerm)

{
  int iVar1;
  bool bVar2;
  word wVar3;
  word wVar4;
  bool bVar5;
  word *pOut;
  bool bVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  int iVar10;
  word *pIn;
  int local_20c0 [2];
  int pStore [32];
  word pFunc [1024];
  
  If_CluCountOnesInCofs(pTruth,nVars,pStore);
  uVar9 = 0;
  uVar7 = 0;
  if (0 < nVars) {
    uVar7 = (ulong)(uint)nVars;
  }
  uVar8 = 0;
  local_20c0[0] = nVars;
  for (; uVar7 != uVar9; uVar9 = uVar9 + 1) {
    wVar3 = pFunc[uVar9 - 0x10];
    iVar10 = *(int *)((long)pFunc + uVar9 * 8 + -0x7c);
    if (iVar10 < (int)wVar3) {
      uVar8 = uVar8 | 1 << ((uint)uVar9 & 0x1f);
      *(int *)(pFunc + (uVar9 - 0x10)) = iVar10;
      *(int *)((long)pFunc + uVar9 * 8 + -0x7c) = (int)wVar3;
      If_CluChangePhase(pTruth,local_20c0[0],(uint)uVar9);
    }
  }
  for (uVar9 = 0; uVar7 != uVar9; uVar9 = uVar9 + 1) {
    pCanonPerm[uVar9] = (int)uVar9;
  }
  iVar10 = 1;
  if (1 < local_20c0[0]) {
    iVar10 = local_20c0[0];
  }
  bVar5 = true;
  bVar6 = false;
  uVar7 = 0;
  local_20c0[1] = uVar8;
  pOut = pFunc;
  do {
    while (pIn = pTruth, uVar9 = uVar7, pTruth = pIn, iVar10 - 1 != uVar9) {
      wVar3 = pFunc[uVar9 - 0x10];
      wVar4 = pFunc[uVar9 - 0xf];
      uVar7 = uVar9 + 1;
      if ((int)wVar4 < (int)wVar3) {
        bVar6 = (bool)(bVar6 ^ 1);
        *(ulong *)(pCanonPerm + uVar9) =
             CONCAT44((int)*(undefined8 *)(pCanonPerm + uVar9),
                      (int)((ulong)*(undefined8 *)(pCanonPerm + uVar9) >> 0x20));
        local_20c0[uVar7 * 2] = (int)wVar4;
        *(int *)(pFunc + (uVar9 - 0xf)) = (int)wVar3;
        iVar1 = pStore[uVar7 * 2 + -1];
        pStore[uVar7 * 2 + -1] = *(int *)((long)pFunc + uVar7 * 8 + -0x7c);
        *(int *)((long)pFunc + uVar7 * 8 + -0x7c) = iVar1;
        If_CluSwapAdjacent(pOut,pIn,(int)uVar9,local_20c0[0]);
        bVar5 = false;
        pTruth = pOut;
        pOut = pIn;
      }
    }
    bVar2 = !bVar5;
    uVar7 = 0;
    bVar5 = true;
  } while (bVar2);
  if (bVar6) {
    If_CluCopy(pOut,pIn,local_20c0[0]);
  }
  return local_20c0[1];
}

Assistant:

unsigned If_CluSemiCanonicize( word * pTruth, int nVars, int * pCanonPerm )
{
    word pFunc[CLU_WRD_MAX], * pIn = pTruth, * pOut = pFunc, * pTemp;
    int pStore[CLU_VAR_MAX*2];
    unsigned uCanonPhase = 0;
    int i, Temp, fChange, Counter = 0;
//Kit_DsdPrintFromTruth( (unsigned*)pTruth, nVars ); printf( "\n" );

    // collect signatures 
    If_CluCountOnesInCofs( pTruth, nVars, pStore );
    // canonicize phase
    for ( i = 0; i < nVars; i++ )
    {
        if ( pStore[2*i+0] <= pStore[2*i+1] )
            continue;
        uCanonPhase |= (1 << i);
        Temp = pStore[2*i+0];
        pStore[2*i+0] = pStore[2*i+1];
        pStore[2*i+1] = Temp;
        If_CluChangePhase( pIn, nVars, i );
    }
    // compute permutation
    for ( i = 0; i < nVars; i++ )
        pCanonPerm[i] = i;
    do {
        fChange = 0;
        for ( i = 0; i < nVars-1; i++ )
        {
            if ( pStore[2*i] <= pStore[2*(i+1)] )
                continue;
            Counter++;
            fChange = 1;

            Temp = pCanonPerm[i];
            pCanonPerm[i] = pCanonPerm[i+1];
            pCanonPerm[i+1] = Temp;

            Temp = pStore[2*i];
            pStore[2*i] = pStore[2*(i+1)];
            pStore[2*(i+1)] = Temp;

            Temp = pStore[2*i+1];
            pStore[2*i+1] = pStore[2*(i+1)+1];
            pStore[2*(i+1)+1] = Temp;

            If_CluSwapAdjacent( pOut, pIn, i, nVars );
            pTemp = pIn; pIn = pOut; pOut = pTemp;
        }
    } while ( fChange );
    // swap if it was moved an odd number of times
    if ( Counter & 1 )
        If_CluCopy( pOut, pIn, nVars );
    return uCanonPhase;
}